

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O1

err_t EBML_ElementRenderHead
                (ebml_element *Element,stream *Output,bool_t bKeepPosition,filepos_t *Rendered)

{
  uint8_t SizeLength;
  uint uVar1;
  filepos_t fVar2;
  byte bVar3;
  long lVar4;
  void *pvVar5;
  err_t eVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong CodedSize;
  uint8_t FinalHead [12];
  size_t i;
  uint8_t auStack_45 [13];
  undefined1 local_38 [8];
  
  if (Output == (stream *)0x0) {
    __assert_fail("(const void*)(Output)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                  ,0x134,
                  "err_t EBML_ElementRenderHead(ebml_element *, struct stream *, bool_t, filepos_t *)"
                 );
  }
  bVar3 = 0;
  lVar4 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
  uVar1 = Element->Context->Id;
  lVar8 = 1;
  lVar7 = lVar8;
  if ((0xff < uVar1) && (lVar8 = 2, lVar7 = lVar8, 0xffff < uVar1)) {
    lVar8 = 4 - (ulong)(uVar1 < 0x1000000);
    lVar7 = lVar8;
  }
  do {
    auStack_45[lVar8] = (uint8_t)(uVar1 >> (bVar3 & 0x1f));
    bVar3 = bVar3 + 8;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  fVar2 = Element->DataSize;
  SizeLength = Element->SizeLength;
  pvVar5 = Node_GetData((node *)Element,0x100,1);
  bVar3 = EBML_CodedSizeLength(fVar2,SizeLength,(ulong)(pvVar5 == (void *)0x0));
  fVar2 = Element->DataSize;
  CodedSize = (ulong)bVar3;
  pvVar5 = Node_GetData((node *)Element,0x100,1);
  EBML_CodedValueLength(fVar2,CodedSize,auStack_45 + lVar7 + 1,(ulong)(pvVar5 == (void *)0x0));
  eVar6 = (**(code **)((long)(Output->Base).VMT + 0x70))
                    (Output,auStack_45 + 1,lVar7 + CodedSize,local_38);
  lVar8 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
  if (bKeepPosition == 0) {
    lVar7 = lVar8 - (lVar7 + CodedSize);
    Element->ElementPosition = lVar7;
    uVar1 = Element->Context->Id;
    lVar9 = 1;
    if ((0xff < uVar1) && (lVar9 = 2, 0xffff < uVar1)) {
      lVar9 = 4 - (ulong)(uVar1 < 0x1000000);
    }
    lVar9 = lVar9 + lVar7;
    Element->SizePosition = lVar9;
    Element->EndPosition = lVar9 + CodedSize + Element->DataSize;
  }
  if (Rendered != (filepos_t *)0x0) {
    *Rendered = lVar8 - lVar4;
  }
  return eVar6;
}

Assistant:

err_t EBML_ElementRenderHead(ebml_element *Element, struct stream *Output, bool_t bKeepPosition, filepos_t *Rendered)
{
    err_t Err;
    uint8_t FinalHead[4+8]; // Class D + 64 bits coded size
    size_t i,FinalHeadSize;
    int CodedSize;
    filepos_t PosAfter,PosBefore = Stream_Seek(Output,0,SEEK_CUR);

    FinalHeadSize = EBML_FillBufferID(FinalHead,sizeof(FinalHead),Element->Context->Id);

    CodedSize = EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element));
    EBML_CodedValueLength(Element->DataSize, CodedSize, &FinalHead[FinalHeadSize], EBML_ElementIsFiniteSize(Element));
    FinalHeadSize += CodedSize;

    Err = Stream_Write(Output, FinalHead, FinalHeadSize, &i);
    PosAfter = Stream_Seek(Output,0,SEEK_CUR);
    if (!bKeepPosition) {
        Element->ElementPosition = PosAfter - FinalHeadSize;
        Element->SizePosition = Element->ElementPosition + GetIdLength(Element->Context->Id);
        Element->EndPosition = Element->SizePosition + CodedSize + Element->DataSize;
    }
    if (Rendered)
        *Rendered = PosAfter - PosBefore;
    return Err;
}